

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yin.c
# Opt level: O2

void subelems_deallocator(size_t count,yin_subelement *subelems)

{
  ly_stmt lVar1;
  void **ppvVar2;
  bool bVar3;
  
  ppvVar2 = &subelems->dest;
  while (bVar3 = count != 0, count = count - 1, bVar3) {
    lVar1 = ((yin_subelement *)(ppvVar2 + -1))->type;
    if (((((lVar1 - LY_STMT_NOTIFICATION < 0x40) &&
          ((0x800000008000808bU >> ((ulong)(lVar1 - LY_STMT_NOTIFICATION) & 0x3f) & 1) != 0)) ||
         (lVar1 == LY_STMT_AUGMENT)) ||
        ((((lVar1 == LY_STMT_CASE || (lVar1 == LY_STMT_CHOICE)) ||
          ((lVar1 == LY_STMT_CONTAINER || ((lVar1 == LY_STMT_GROUPING || (lVar1 == LY_STMT_LEAF)))))
          ) || (lVar1 == LY_STMT_LEAF_LIST)))) ||
       ((((lVar1 == LY_STMT_LIST || (lVar1 == LY_STMT_USES)) || (lVar1 == LY_STMT_IMPORT)) ||
        ((lVar1 == LY_STMT_TYPEDEF || (lVar1 == LY_STMT_INCLUDE)))))) {
      free(*ppvVar2);
    }
    ppvVar2 = ppvVar2 + 3;
  }
  free(subelems);
  return;
}

Assistant:

static void
subelems_deallocator(size_t count, struct yin_subelement *subelems)
{
    for (size_t i = 0; i < count; ++i) {
        if (HAS_META(subelems[i].type)) {
            free(subelems[i].dest);
        }
    }

    free(subelems);
}